

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::(anonymous_namespace)::ExpandWithIndices<std::array<float,2ul>>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *dest)

{
  uint uVar1;
  size_type sVar2;
  value_type_conflict vVar3;
  long *plVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  _Alloc_hider local_a8;
  undefined8 local_a0;
  ulong local_98;
  long lStack_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  plVar4 = (long *)CONCAT44(in_register_0000000c,elementSize);
  if (indices == (vector<int,_std::allocator<int>_> *)0x0) {
    local_a8._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_a8);
  }
  else if (*plVar4 == plVar4[1]) {
    std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator=
              ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)indices,
               (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)this);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
  else if (((int)values == 0) ||
          (uVar9 = (ulong)values & 0xffffffff,
          (ulong)(*(long *)(this + 8) - *(long *)this >> 3) % uVar9 != 0)) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
  }
  else {
    std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::resize
              ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)indices,
               (plVar4[1] - *plVar4 >> 2) * uVar9);
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_a8._M_p = (pointer)0x0;
    lVar5 = *plVar4;
    if (plVar4[1] == lVar5) {
      vVar3 = true;
    }
    else {
      vVar3 = true;
      do {
        uVar1 = *(uint *)(lVar5 + (long)local_a8._M_p * 4);
        if (((int)uVar1 < 0) ||
           (uVar7 = ((ulong)uVar1 + 1) * uVar9, uVar8 = *(long *)(this + 8) - *(long *)this >> 3,
           uVar8 <= uVar7 && uVar7 - uVar8 != 0)) {
          if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                       (iterator)
                       local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a8);
          }
          else {
            *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_a8._M_p;
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          vVar3 = false;
        }
        else {
          uVar7 = 0;
          do {
            *(undefined8 *)
             ((indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start + (long)local_a8._M_p * uVar9 * 2 + uVar7 * 2) =
                 *(undefined8 *)(*(long *)this + (ulong)uVar1 * uVar9 * 8 + uVar7 * 8);
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        local_a8._M_p = local_a8._M_p + 1;
        lVar5 = *plVar4;
      } while (local_a8._M_p < (ulong *)(plVar4[1] - lVar5 >> 2));
    }
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = vVar3;
    }
    else {
      tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&local_88,5);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x252c96);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_60 = *puVar6;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar6;
        local_70 = (ulong *)*plVar4;
      }
      local_98 = local_60;
      sVar2 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_70 == &local_60) {
        lStack_90 = lStack_58;
        local_a8._M_p = (pointer)&local_98;
      }
      else {
        local_a8._M_p = (pointer)local_70;
      }
      local_60 = local_60 & 0xffffffffffffff00;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      puVar6 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .field_0 + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = puVar6;
      if ((ulong *)local_a8._M_p == &local_98) {
        *puVar6 = local_98;
        *(long *)((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x18) = lStack_90;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = local_a8._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10) = local_98;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = sVar2;
      local_98 = local_98 & 0xffffffffffffff00;
      local_68 = 0;
      local_a0 = 0;
      local_a8._M_p = (pointer)&local_98;
      local_70 = &local_60;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}